

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

void StringFormatter<std::__cxx11::string_const&,long,std::__cxx11::string>::
     format<std::__cxx11::string_const>
               (ostream *os,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  pointer pcVar6;
  ostream oVar7;
  long lVar8;
  void *pvVar9;
  runtime_error *this;
  uint uVar10;
  char *pcVar11;
  bool bVar12;
  ostream oVar13;
  char *__nptr;
  char *pcVar14;
  char *q;
  char *local_98;
  undefined8 local_90;
  long local_88;
  char *local_80;
  long local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  do {
    cVar2 = *fmt;
    if (cVar2 == '%') {
      cVar2 = fmt[1];
      if (cVar2 != '%') {
        pcVar11 = fmt + (cVar2 == '-');
        cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
        bVar12 = cVar3 == ' ' || cVar3 == '+';
        __nptr = pcVar11 + (ulong)bVar12 + 1;
        if (*__nptr == ',') {
          __nptr = pcVar11 + (ulong)bVar12 + 2;
          oVar13 = (ostream)0x2c;
        }
        else {
          oVar13 = (ostream)0x20;
          if (*__nptr == '0') {
            __nptr = pcVar11 + (ulong)bVar12 + 2;
            oVar13 = (ostream)0x30;
          }
        }
        local_78 = strtol(__nptr,&local_98,10);
        local_80 = (char *)CONCAT71(local_98._1_7_,(char)local_98);
        if (*local_80 == '.') {
          pcVar14 = local_80 + 1;
          lVar8 = strtol(pcVar14,&local_98,10);
          local_90 = CONCAT71((int7)((ulong)pcVar11 >> 8),
                              pcVar14 != (char *)CONCAT71(local_98._1_7_,(char)local_98));
          local_88 = (long)(int)lVar8;
          pcVar11 = (char *)CONCAT71(local_98._1_7_,(char)local_98);
        }
        else {
          local_88 = 0;
          local_90 = 0;
          pcVar11 = local_80;
        }
        do {
          pcVar14 = pcVar11;
          cVar4 = *pcVar14;
          pvVar9 = memchr("qhlLzjt",(int)cVar4,8);
          pcVar11 = pcVar14 + 1;
        } while (pvVar9 != (void *)0x0);
        pcVar11 = pcVar14;
        if ((cVar4 == 'I') && (pcVar11 = pcVar14 + 1, (byte)(pcVar14[2] | 2U) == 0x36)) {
          pcVar11 = pcVar14 + 3;
        }
        cVar4 = *pcVar11;
        StringFormatter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::applytype(os,cVar4);
        lVar8 = *(long *)(*(long *)os + -0x18);
        if (cVar3 == '+') {
          uVar10 = *(uint *)(os + lVar8 + 0x18) | 0x800;
        }
        else {
          uVar10 = *(uint *)(os + lVar8 + 0x18) & 0xfffff7ff;
        }
        *(uint *)(os + lVar8 + 0x18) = uVar10;
        if (cVar2 == '-' || cVar3 == '+') {
          *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
               (uint)(cVar2 == '-') * 0x10 +
               (*(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f) + 0x10;
        }
        lVar8 = *(long *)os;
        lVar5 = *(long *)(lVar8 + -0x18);
        if (__nptr == local_80) {
          *(undefined8 *)(os + lVar5 + 0x10) = 0;
        }
        else {
          *(long *)(os + lVar5 + 0x10) = (long)(int)local_78;
          if (cVar2 != '-' && cVar3 != '+') {
            lVar8 = *(long *)(lVar8 + -0x18);
            *(uint *)(os + lVar8 + 0x18) = *(uint *)(os + lVar8 + 0x18) & 0xffffff4f | 0x80;
          }
        }
        if ((char)local_90 != '\0') {
          *(long *)(os + *(long *)(*(long *)os + -0x18) + 8) = local_88;
        }
        poVar1 = os + *(long *)(*(long *)os + -0x18);
        if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
          oVar7 = (ostream)std::ios::widen((char)poVar1);
          poVar1[0xe0] = oVar7;
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = oVar13;
        if ((cVar4 != 'b') || (bVar12 = output_hex_data<std::__cxx11::string>(os,value), !bVar12)) {
          pvVar9 = memchr("iduoxX",(int)cVar4,7);
          if (pvVar9 != (void *)0x0) {
            pcVar6 = (value->_M_dataplus)._M_p;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_50,pcVar6,pcVar6 + value->_M_string_length);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          if (cVar4 == 's') {
            pcVar6 = (value->_M_dataplus)._M_p;
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar6,pcVar6 + value->_M_string_length);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(value->_M_dataplus)._M_p,value->_M_string_length);
        }
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
        StringFormatter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::format(os,pcVar11 + (cVar4 != '\0'));
        return;
      }
      fmt = fmt + 2;
      local_98._0_1_ = '%';
    }
    else {
      if (cVar2 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fmt = fmt + 1;
      local_98._0_1_ = cVar2;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_98,1);
  } while( true );
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }